

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_sameName(ENCODING *enc,char *ptr1,char *ptr2)

{
  byte bVar1;
  byte bVar2;
  uint local_3c;
  uint local_2c;
  byte *local_28;
  char *ptr2_local;
  char *ptr1_local;
  ENCODING *enc_local;
  
  local_28 = (byte *)ptr2;
  ptr2_local = ptr1;
  do {
    if (ptr2_local[1] == '\0') {
      local_2c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr2_local);
    }
    else {
      local_2c = unicode_byte_type(ptr2_local[1],*ptr2_local);
    }
    switch(local_2c) {
    case 7:
      bVar1 = *ptr2_local;
      bVar2 = *local_28;
      local_28 = local_28 + 1;
      ptr2_local = ptr2_local + 1;
      if (bVar1 != bVar2) {
        return 0;
      }
    case 6:
      bVar1 = *ptr2_local;
      bVar2 = *local_28;
      local_28 = local_28 + 1;
      ptr2_local = ptr2_local + 1;
      if (bVar1 != bVar2) {
        return 0;
      }
    case 5:
      if (*ptr2_local != *local_28) {
        return 0;
      }
      if (ptr2_local[1] != local_28[1]) {
        return 0;
      }
      break;
    default:
      if (local_28[1] == 0) {
        local_3c = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_28);
      }
      else {
        local_3c = unicode_byte_type(local_28[1],*local_28);
      }
      if (((local_3c - 5 < 3) || (local_3c - 0x16 < 6)) || (local_3c == 0x1d)) {
        enc_local._4_4_ = 0;
      }
      else {
        enc_local._4_4_ = 1;
      }
      return enc_local._4_4_;
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
      if (*local_28 != *ptr2_local) {
        return 0;
      }
      if (local_28[1] != ptr2_local[1]) {
        return 0;
      }
    }
    ptr2_local = ptr2_local + 2;
    local_28 = local_28 + 2;
  } while( true );
}

Assistant:

static
int PREFIX(sameName)(const ENCODING *enc, const char *ptr1, const char *ptr2)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr1)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (*ptr1++ != *ptr2++) \
        return 0;
    LEAD_CASE(4) LEAD_CASE(3) LEAD_CASE(2)
#undef LEAD_CASE
      /* fall through */
      if (*ptr1++ != *ptr2++)
        return 0;
      break;
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      if (*ptr2++ != *ptr1++)
        return 0;
      if (MINBPC(enc) > 1) {
        if (*ptr2++ != *ptr1++)
          return 0;
        if (MINBPC(enc) > 2) {
          if (*ptr2++ != *ptr1++)
            return 0;
          if (MINBPC(enc) > 3) {
            if (*ptr2++ != *ptr1++)
              return 0;
          }
        }
      }
      break;
    default:
      if (MINBPC(enc) == 1 && *ptr1 == *ptr2)
        return 1;
      switch (BYTE_TYPE(enc, ptr2)) {
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
      case BT_NONASCII:
      case BT_NMSTRT:
#ifdef XML_NS
      case BT_COLON:
#endif
      case BT_HEX:
      case BT_DIGIT:
      case BT_NAME:
      case BT_MINUS:
        return 0;
      default:
        return 1;
      }
    }
  }
  /* not reached */
}